

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PathTypeHandler.cpp
# Opt level: O2

PathTypeHandlerBase * __thiscall
Js::PathTypeHandlerBase::DeoptimizeObjectHeaderInlining
          (PathTypeHandlerBase *this,JavascriptLibrary *library)

{
  WriteBarrierPtr<const_Js::PropertyRecord> *this_00;
  ushort uVar1;
  Type TVar2;
  ScriptContext *pSVar3;
  code *pcVar4;
  Type TVar5;
  undefined8 this_01;
  bool bVar6;
  PropertyTypes values;
  PropertyIndex PVar7;
  int iVar8;
  undefined4 *puVar9;
  TypePath *typePath;
  undefined4 extraout_var;
  Recycler *pRVar10;
  ObjectSlotAttributes *attributes;
  undefined4 extraout_var_00;
  PathTypeHandlerWithAttr *this_02;
  long lVar11;
  char *pcVar12;
  uint size;
  ulong uVar13;
  undefined1 local_88 [8];
  TrackAllocData data;
  PathTypeSetterSlotIndex *local_48;
  char *__src;
  
  bVar6 = DynamicTypeHandler::IsObjectHeaderInlinedTypeHandler(&this->super_DynamicTypeHandler);
  if (!bVar6) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar9 = 1;
    bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
                                ,0xa46,"(IsObjectHeaderInlinedTypeHandler())",
                                "IsObjectHeaderInlinedTypeHandler()");
    if (!bVar6) {
      pcVar4 = (code *)invalidInstructionException();
      (*pcVar4)();
    }
    *puVar9 = 0;
  }
  pRVar10 = library->recycler;
  size = (uint)((this->super_DynamicTypeHandler).unusedBytes >> 1);
  uVar13 = (ulong)size;
  typePath = TypePath::New(pRVar10,size);
  iVar8 = (*(this->super_DynamicTypeHandler)._vptr_DynamicTypeHandler[0x6b])(this);
  __src = (char *)CONCAT44(extraout_var,iVar8);
  lVar11 = 0x10;
  pcVar12 = __src;
  data._32_8_ = pRVar10;
  while (this_01 = data._32_8_, bVar6 = uVar13 != 0, uVar13 = uVar13 - 1, bVar6) {
    this_00 = (WriteBarrierPtr<const_Js::PropertyRecord> *)((long)&(typePath->data).ptr + lVar11);
    Memory::WriteBarrierPtr<const_Js::PropertyRecord>::operator=
              (this_00,(WriteBarrierPtr<const_Js::PropertyRecord> *)
                       ((long)&(((this->typePath).ptr)->data).ptr + lVar11));
    if ((__src == (char *)0x0) || (*pcVar12 != -9)) {
      TypePath::AddInternal<true>(typePath,this_00->ptr);
    }
    else {
      TypePath::AddInternal<false>(typePath,this_00->ptr);
    }
    lVar11 = lVar11 + 8;
    pcVar12 = pcVar12 + 1;
  }
  if (__src == (char *)0x0) {
    pSVar3 = (library->super_JavascriptLibraryBase).scriptContext.ptr;
    uVar1 = (this->super_DynamicTypeHandler).unusedBytes;
    TVar5 = (this->super_DynamicTypeHandler).slotCapacity;
    TVar2 = (this->super_DynamicTypeHandler).inlineSlotCapacity;
    PVar7 = DynamicTypeHandler::GetObjectHeaderInlinableSlotCapacity();
    this_02 = (PathTypeHandlerWithAttr *)
              PathTypeHandlerNoAttr::New
                        (pSVar3,typePath,uVar1 >> 1,(PropertyIndex)TVar5,TVar2 - PVar7,0x20,false,
                         false,(DynamicType *)0x0);
  }
  else {
    uVar13 = (ulong)((typePath->data).ptr)->pathSize;
    local_88 = (undefined1  [8])&ObjectSlotAttributes::typeinfo;
    data.typeinfo = (type_info *)0x0;
    data.count = (size_t)anon_var_dwarf_9af3a56;
    data.filename._0_4_ = 0xa6e;
    data.plusSize = uVar13;
    pRVar10 = Memory::Recycler::TrackAllocInfo((Recycler *)data._32_8_,(TrackAllocData *)local_88);
    local_48 = (PathTypeSetterSlotIndex *)0x0;
    attributes = Memory::AllocateArray<Memory::Recycler,Js::ObjectSlotAttributes,false>
                           ((Memory *)pRVar10,(Recycler *)Memory::Recycler::AllocLeaf,0,uVar13);
    memcpy(attributes,__src,uVar13);
    iVar8 = (*(this->super_DynamicTypeHandler)._vptr_DynamicTypeHandler[0x6f])(this);
    if ((void *)CONCAT44(extraout_var_00,iVar8) != (void *)0x0) {
      local_88 = (undefined1  [8])&unsigned_char::typeinfo;
      data.typeinfo = (type_info *)0x0;
      data.count = (size_t)anon_var_dwarf_9af3a56;
      data.filename._0_4_ = 0xa79;
      data.plusSize = uVar13;
      pRVar10 = Memory::Recycler::TrackAllocInfo((Recycler *)this_01,(TrackAllocData *)local_88);
      local_48 = Memory::AllocateArray<Memory::Recycler,unsigned_char,false>
                           ((Memory *)pRVar10,(Recycler *)Memory::Recycler::AllocLeaf,0,uVar13);
      memcpy(local_48,(void *)CONCAT44(extraout_var_00,iVar8),uVar13);
    }
    pSVar3 = (library->super_JavascriptLibraryBase).scriptContext.ptr;
    iVar8 = (*(this->super_DynamicTypeHandler)._vptr_DynamicTypeHandler[0x71])(this);
    uVar1 = (this->super_DynamicTypeHandler).unusedBytes;
    TVar5 = (this->super_DynamicTypeHandler).slotCapacity;
    TVar2 = (this->super_DynamicTypeHandler).inlineSlotCapacity;
    PVar7 = DynamicTypeHandler::GetObjectHeaderInlinableSlotCapacity();
    this_02 = PathTypeHandlerWithAttr::New
                        (pSVar3,typePath,attributes,local_48,(PathTypeSetterSlotIndex)iVar8,
                         uVar1 >> 1,(PropertyIndex)TVar5,TVar2 - PVar7,0x20,false,false,
                         (DynamicType *)0x0);
  }
  DynamicTypeHandler::SetMayBecomeShared((DynamicTypeHandler *)this_02);
  values = DynamicTypeHandler::GetPropertyTypes(&this->super_DynamicTypeHandler);
  DynamicTypeHandler::CopyPropertyTypes((DynamicTypeHandler *)this_02,0xb0,values);
  return (PathTypeHandlerBase *)this_02;
}

Assistant:

PathTypeHandlerBase *PathTypeHandlerBase::DeoptimizeObjectHeaderInlining(JavascriptLibrary *const library)
    {
        Assert(IsObjectHeaderInlinedTypeHandler());

        // Clone the type Path here to evolve separately
        Recycler * recycler = library->GetRecycler();
        uint16 pathLength = GetPathLength();
        TypePath * clonedPath = TypePath::New(recycler, pathLength);

        ObjectSlotAttributes *attributes = this->GetAttributeArray();
        for (PropertyIndex i = 0; i < pathLength; i++)
        {
            clonedPath->assignments[i] = GetTypePath()->assignments[i];
            if (attributes && attributes[i] == ObjectSlotAttr_Setter)
            {
                clonedPath->AddInternal<false>(clonedPath->assignments[i]);
            }
            else
            {
                clonedPath->AddInternal<true>(clonedPath->assignments[i]);
            }
        }

        // We don't copy the fixed fields, as we will be sharing this type anyways later and the fixed fields vector has to be invalidated.
        PathTypeHandlerBase * clonedTypeHandler;
        if (attributes == nullptr)
        {
            clonedTypeHandler =
                PathTypeHandlerNoAttr::New(
                    library->GetScriptContext(),
                    clonedPath,
                    GetPathLength(),
                    static_cast<PropertyIndex>(GetSlotCapacity()),
                    GetInlineSlotCapacity() - GetObjectHeaderInlinableSlotCapacity(),
                    sizeof(DynamicObject),
                    false,
                    false);
        }
        else
        {
            uint8 newTypePathSize = clonedPath->GetPathSize();

            ObjectSlotAttributes * newAttributes = RecyclerNewArrayLeaf(recycler, ObjectSlotAttributes, newTypePathSize);
            memcpy(newAttributes, attributes, sizeof(ObjectSlotAttributes) * newTypePathSize);

            PathTypeSetterSlotIndex * setters = GetSetterSlots();
            PathTypeSetterSlotIndex * newSetters;
            if (setters == nullptr)
            {
                newSetters = nullptr;
            }
            else
            {
                newSetters = RecyclerNewArrayLeaf(recycler, PathTypeSetterSlotIndex, newTypePathSize);
                memcpy(newSetters, setters, sizeof(PathTypeSetterSlotIndex) * newTypePathSize);
            }

            clonedTypeHandler =
                PathTypeHandlerWithAttr::New(
                    library->GetScriptContext(),
                    clonedPath,
                    newAttributes,
                    newSetters,
                    GetSetterCount(),
                    GetPathLength(),
                    static_cast<PropertyIndex>(GetSlotCapacity()),
                    GetInlineSlotCapacity() - GetObjectHeaderInlinableSlotCapacity(),
                    sizeof(DynamicObject),
                    false,
                    false);
        }
        clonedTypeHandler->SetMayBecomeShared();
        clonedTypeHandler->CopyPropertyTypes(PropertyTypesWritableDataOnly | PropertyTypesWritableDataOnlyDetection | PropertyTypesHasSpecialProperties, this->GetPropertyTypes());

        return clonedTypeHandler;
    }